

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfwht_gray.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
pow2Vector<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,size_t k)

{
  result_type_conflict1 rVar1;
  uint uVar2;
  size_t i;
  size_type sVar3;
  size_type __n;
  allocator_type local_1da9;
  vector<double,_std::allocator<double>_> v;
  uniform_real_distribution<double> local_1d88;
  mt19937_64 gen;
  random_device rd;
  
  std::random_device::random_device(&rd);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&gen,(ulong)uVar2);
  local_1d88._M_param._M_a._0_4_ = 0;
  local_1d88._M_param._M_a._4_4_ = 0;
  local_1d88._M_param._M_b._0_4_ = 0;
  local_1d88._M_param._M_b._4_4_ = 0x3ff00000;
  __n = 1L << ((byte)k & 0x3f);
  std::vector<double,_std::allocator<double>_>::vector(&v,__n,&local_1da9);
  for (sVar3 = 0; __n != sVar3; sVar3 = sVar3 + 1) {
    rVar1 = std::uniform_real_distribution<double>::operator()(&local_1d88,&gen);
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [sVar3] = rVar1;
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start =
       v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  std::random_device::~random_device(&rd);
  return __return_storage_ptr__;
}

Assistant:

auto pow2Vector( const size_t k ) {

  // random entries
  std::random_device                rd ;
  std::mt19937_64                   gen( rd() ) ;
  std::uniform_real_distribution<>  dis( 0.0, 1.0 ) ;

  // generate vector
  std::vector< T > v( size_t(1)<<k ) ;
  for ( size_t i = 0; i < (size_t(1)<<k); i++ ) {
    v[i] = dis(gen) ;
  }

  return v ;
}